

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpkeyhashtable.h
# Opt level: O1

bool __thiscall jrtplib::RTPSources::GotoFirstSourceWithData(RTPSources *this)

{
  RTPInternalSourceData *pRVar1;
  bool bVar2;
  HashElement *pHVar3;
  
  pHVar3 = (this->sourcelist).firsthashelem;
  (this->sourcelist).curhashelem = pHVar3;
  bVar2 = false;
  do {
    if (pHVar3 == (HashElement *)0x0) {
      return bVar2;
    }
    pRVar1 = pHVar3->element;
    if (((pRVar1->super_RTPSourceData).validated == true) &&
       ((pRVar1->super_RTPSourceData).packetlist.
        super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>._M_impl.
        _M_node.super__List_node_base._M_next !=
        (_List_node_base *)&(pRVar1->super_RTPSourceData).packetlist)) {
      bVar2 = true;
    }
    else {
      pHVar3 = pHVar3->listnext;
      (this->sourcelist).curhashelem = pHVar3;
    }
  } while (!bVar2);
  return bVar2;
}

Assistant:

void GotoFirstElement()					{ curhashelem = firsthashelem; }